

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  long lVar1;
  Config *this_local;
  
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__Config_0029d948;
  lVar1 = *(long *)(*(long *)&this->m_os + -0x18);
  std::ios::rdbuf();
  std::ios::rdbuf((streambuf *)(&this->m_os + lVar1));
  Stream::release(&this->m_stream);
  std::ostream::~ostream(&this->m_os);
  ConfigData::~ConfigData(&this->m_data);
  IConfig::~IConfig(&this->super_IConfig);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( std::cout.rdbuf() );
            m_stream.release();
        }